

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::
logAndSetTestResult(RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                          *results)

{
  pointer pSVar1;
  TestContext *this_00;
  int iVar2;
  pointer pRVar3;
  pointer pSVar4;
  long lVar5;
  int precision;
  pointer pRVar6;
  value_type *__val;
  pointer pRVar7;
  RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
  *pRVar8;
  undefined8 *puVar9;
  pointer pRVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  RenderSampleAnalyzeResult RVar15;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  mappedResults;
  string local_68;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  local_48;
  
  bVar14 = 0;
  local_48.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4 = (results->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (results->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)pSVar1 - (long)pSVar4 >> 3;
  uVar13 = lVar12 * 0x2e8ba2e8ba2e8ba3;
  if (pSVar1 != pSVar4) {
    if (0x1c71c71c71c71c7 < uVar13) {
      std::__throw_length_error("vector::_M_default_append");
    }
    local_48.
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(lVar12 * 0x1745d1745d1745d8);
    (local_48.
     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->uploadedDataSize = 0;
    (local_48.
     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->renderDataSize = 0;
    (local_48.
     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->unrelatedDataSize = 0;
    (local_48.
     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->numVertices = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).firstRenderDuration = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).uploadDuration = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).secondRenderDuration = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).readDuration = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).totalDuration = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).renderReadDuration = 0;
    ((local_48.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->duration).fitResponseDuration = 0;
    if ((long)pSVar1 - (long)pSVar4 != 0x58) {
      uVar13 = 0x48;
      do {
        pRVar7 = local_48.
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar9 = (undefined8 *)
                 ((long)&(local_48.
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->uploadedDataSize + uVar13);
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar9 = *(undefined8 *)pRVar7;
          pRVar7 = (pointer)((long)pRVar7 + (ulong)bVar14 * -0x10 + 8);
          puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
        }
        uVar13 = uVar13 + 0x48;
      } while (lVar12 * 0x1745d1745d1745d8 != uVar13);
    }
    pSVar4 = (results->
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)local_48.
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12 * 0x1745d1745d1745d8);
    uVar13 = ((long)(results->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 3) *
             0x2e8ba2e8ba2e8ba3;
  }
  pRVar3 = local_48.
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pRVar7 = local_48.
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)(uint)uVar13) {
    uVar11 = 0;
    pRVar6 = local_48.
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pRVar8 = &pSVar4->result;
      pRVar10 = pRVar6;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        iVar2 = pRVar8->renderDataSize;
        pRVar10->uploadedDataSize = pRVar8->uploadedDataSize;
        pRVar10->renderDataSize = iVar2;
        pRVar8 = (RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                  *)((long)pRVar8 + (ulong)bVar14 * -0x10 + 8);
        pRVar10 = (pointer)((long)pRVar10 + (ulong)bVar14 * -0x10 + 8);
      }
      uVar11 = uVar11 + 1;
      pRVar6 = pRVar6 + 1;
      pSVar4 = (pointer)(&pSVar4->result + 1);
    } while (uVar11 < ((uint)uVar13 & 0x7fffffff));
  }
  local_48.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  RVar15 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                     (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log,&local_48);
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (RVar15.renderRateAtRange < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_68,(de *)0x2,RVar15.renderRateAtRange * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_68._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_68,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (pRVar7 != (pointer)0x0) {
    operator_delete(pRVar7,(long)pRVar3 - (long)pRVar7);
  }
  return;
}

Assistant:

void RenderCase<SampleType>::logAndSetTestResult (const std::vector<SampleResult>& results)
{
	std::vector<RenderSampleResult<SampleType> > mappedResults;

	mapResultsToRenderRateFormat(mappedResults, results);

	{
		const RenderSampleAnalyzeResult	analysis	= analyzeSampleResults(m_testCtx.getLog(), mappedResults);
		const float						rate		= analysis.renderRateAtRange;

		if (rate == std::numeric_limits<float>::infinity())
		{
			// sample times are 1) invalid or 2) timer resolution too low
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
		}
		else
		{
			// report transfer rate in millions of MiB/s
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(rate / 1024.0f / 1024.0f, 2).c_str());
		}
	}
}